

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d * tinyusdz::inverse(matrix4d *__return_storage_ptr__,matrix4d *_m)

{
  V *pVVar1;
  double *pdVar2;
  mat<double,_4,_4> *a;
  undefined1 local_110 [8];
  matrix44d inv_m;
  matrix44d m;
  matrix4d *_m_local;
  
  linalg::mat<double,_4,_4>::mat((mat<double,_4,_4> *)&inv_m.w.w);
  pVVar1 = linalg::mat<double,_4,_4>::operator[]((mat<double,_4,_4> *)&inv_m.w.w,0);
  pdVar2 = linalg::vec<double,_4>::operator[](pVVar1,0);
  memcpy(pdVar2,_m,0x80);
  linalg::inverse<double,4>((mat<double,_4,_4> *)local_110,(linalg *)&inv_m.w.w,a);
  value::matrix4d::matrix4d(__return_storage_ptr__);
  pVVar1 = linalg::mat<double,_4,_4>::operator[]((mat<double,_4,_4> *)local_110,0);
  pdVar2 = linalg::vec<double,_4>::operator[](pVVar1,0);
  memcpy(__return_storage_ptr__,pdVar2,0x80);
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d inverse(const value::matrix4d &_m) {
  matrix44d m;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 4 * 4);

  matrix44d inv_m = linalg::inverse(m);

  value::matrix4d outm;

  memcpy(outm.m, &inv_m[0][0], sizeof(double) * 4 * 4);

  return outm;
}